

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O2

ssize_t __thiscall
icu_63::StringTrieBuilder::ListBranchNode::write
          (ListBranchNode *this,int __fd,void *__buf,size_t __n)

{
  int32_t *piVar1;
  int32_t lastRight;
  Node *pNVar2;
  int iVar3;
  uint uVar4;
  int32_t *piVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar7;
  undefined4 in_register_00000034;
  StringTrieBuilder *builder;
  long lVar8;
  ssize_t sVar6;
  
  builder = (StringTrieBuilder *)CONCAT44(in_register_00000034,__fd);
  lVar8 = (long)this->length;
  pNVar2 = this->equal[lVar8 + -1];
  piVar1 = &(this->super_BranchNode).firstEdgeNumber;
  piVar5 = &pNVar2->offset;
  if (pNVar2 == (Node *)0x0) {
    piVar5 = piVar1;
  }
  lastRight = *piVar5;
  do {
    if (this->equal[lVar8 + -2] != (Node *)0x0) {
      Node::writeUnlessInsideRightEdge(this->equal[lVar8 + -2],*piVar1,lastRight,builder);
    }
    lVar8 = lVar8 + -1;
  } while (1 < lVar8);
  uVar7 = this->length - 1;
  if (pNVar2 == (Node *)0x0) {
    (*(builder->super_UObject)._vptr_UObject[0x11])(builder,(ulong)(uint)this->values[(int)uVar7],1)
    ;
  }
  else {
    (*(pNVar2->super_UObject)._vptr_UObject[5])(pNVar2,builder);
  }
  iVar3 = (*(builder->super_UObject)._vptr_UObject[0xf])
                    (builder,(ulong)(ushort)this->units[(int)uVar7]);
  sVar6 = CONCAT44(extraout_var,iVar3);
  lVar8 = 0;
  while( true ) {
    (this->super_BranchNode).super_Node.offset = (int)sVar6;
    if ((int)(uVar7 + (int)lVar8) < 1) break;
    pNVar2 = this->equal[(ulong)uVar7 + lVar8 + -1];
    if (pNVar2 == (Node *)0x0) {
      uVar4 = this->values[(ulong)uVar7 + lVar8 + -1];
    }
    else {
      uVar4 = (int)sVar6 - pNVar2->offset;
    }
    (*(builder->super_UObject)._vptr_UObject[0x11])(builder,(ulong)uVar4,pNVar2 == (Node *)0x0);
    iVar3 = (*(builder->super_UObject)._vptr_UObject[0xf])
                      (builder,(ulong)(ushort)this->units[(ulong)uVar7 + lVar8 + -1]);
    sVar6 = CONCAT44(extraout_var_00,iVar3);
    lVar8 = lVar8 + -1;
  }
  return sVar6;
}

Assistant:

void
StringTrieBuilder::ListBranchNode::write(StringTrieBuilder &builder) {
    // Write the sub-nodes in reverse order: The jump lengths are deltas from
    // after their own positions, so if we wrote the minUnit sub-node first,
    // then its jump delta would be larger.
    // Instead we write the minUnit sub-node last, for a shorter delta.
    int32_t unitNumber=length-1;
    Node *rightEdge=equal[unitNumber];
    int32_t rightEdgeNumber= rightEdge==NULL ? firstEdgeNumber : rightEdge->getOffset();
    do {
        --unitNumber;
        if(equal[unitNumber]!=NULL) {
            equal[unitNumber]->writeUnlessInsideRightEdge(firstEdgeNumber, rightEdgeNumber, builder);
        }
    } while(unitNumber>0);
    // The maxUnit sub-node is written as the very last one because we do
    // not jump for it at all.
    unitNumber=length-1;
    if(rightEdge==NULL) {
        builder.writeValueAndFinal(values[unitNumber], TRUE);
    } else {
        rightEdge->write(builder);
    }
    offset=builder.write(units[unitNumber]);
    // Write the rest of this node's unit-value pairs.
    while(--unitNumber>=0) {
        int32_t value;
        UBool isFinal;
        if(equal[unitNumber]==NULL) {
            // Write the final value for the one string ending with this unit.
            value=values[unitNumber];
            isFinal=TRUE;
        } else {
            // Write the delta to the start position of the sub-node.
            U_ASSERT(equal[unitNumber]->getOffset()>0);
            value=offset-equal[unitNumber]->getOffset();
            isFinal=FALSE;
        }
        builder.writeValueAndFinal(value, isFinal);
        offset=builder.write(units[unitNumber]);
    }
}